

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void Am_Choice_Interim_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  bool set_selected;
  Am_Object local_20;
  Am_Object new_object;
  Am_Object old_object;
  Am_Object *inter_local;
  
  Am_Object::Am_Object(&new_object);
  Am_Object::Am_Object(&local_20);
  pAVar2 = Am_Object::Get(inter,0x16b,0);
  Am_Object::operator=(&new_object,pAVar2);
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::operator=(&local_20,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xdd,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    bVar1 = Am_Object::Valid(&new_object);
    if (bVar1) {
      Am_Object::Set(&new_object,0x173,false,1);
    }
    bVar1 = Am_Object::Valid(&local_20);
    if (bVar1) {
      Am_Object::Set(&local_20,0x173,true,1);
    }
  }
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&new_object);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_Interim_Do,
                 (Am_Object inter))
{
  Am_Object old_object, new_object;
  old_object = inter.Get(Am_OLD_INTERIM_VALUE);
  new_object = inter.Get(Am_INTERIM_VALUE);
  bool set_selected = inter.Get(Am_SET_SELECTED);
  if (set_selected) {
    if (old_object.Valid()) {
      Am_REPORT_SET_SEL_VALUE(false, inter, old_object, false);
      old_object.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
    if (new_object.Valid()) {
      Am_REPORT_SET_SEL_VALUE(false, inter, new_object, true);
      new_object.Set(Am_INTERIM_SELECTED, true, Am_OK_IF_NOT_THERE);
    }
  }
}